

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

void __thiscall
chrono::ChQuaternion<double>::Q_from_AngAxis
          (ChQuaternion<double> *this,double angle,ChVector<double> *axis)

{
  double dVar1;
  double dVar2;
  
  dVar1 = sin(angle * 0.5);
  dVar2 = cos(angle * 0.5);
  this->m_data[0] = dVar2;
  this->m_data[1] = dVar1 * axis->m_data[0];
  this->m_data[2] = dVar1 * axis->m_data[1];
  this->m_data[3] = dVar1 * axis->m_data[2];
  return;
}

Assistant:

inline void ChQuaternion<Real>::Q_from_AngAxis(Real angle, const ChVector<Real>& axis) {
    Real halfang = (angle / 2);
    Real sinhalf = sin(halfang);
    m_data[0] = cos(halfang);
    m_data[1] = axis.x() * sinhalf;
    m_data[2] = axis.y() * sinhalf;
    m_data[3] = axis.z() * sinhalf;
}